

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

boolean find_file(char *name,library **lib,long *startp,long *sizep)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  library *lp;
  int j;
  int i;
  long *sizep_local;
  long *startp_local;
  library **lib_local;
  char *name_local;
  
  lp._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (lp._4_4_ < 4) {
      bVar3 = dlb_libs[lp._4_4_].fdata != (FILE *)0x0;
    }
    if (!bVar3) break;
    lVar2 = (long)lp._4_4_;
    for (lp._0_4_ = 0; (long)(int)lp < dlb_libs[lVar2].nentries; lp._0_4_ = (int)lp + 1) {
      iVar1 = strcmp(name,dlb_libs[lVar2].dir[(int)lp].fname);
      if (iVar1 == 0) {
        *lib = dlb_libs + lVar2;
        *startp = dlb_libs[lVar2].dir[(int)lp].foffset;
        *sizep = dlb_libs[lVar2].dir[(int)lp].fsize;
        return '\x01';
      }
    }
    lp._4_4_ = lp._4_4_ + 1;
  }
  *lib = (library *)0x0;
  *sizep = 0;
  *startp = 0;
  return '\0';
}

Assistant:

static boolean find_file(const char *name, library **lib, long *startp, long *sizep)
{
    int i, j;
    library *lp;

    for (i = 0; i < MAX_LIBS && dlb_libs[i].fdata; i++) {
	lp = &dlb_libs[i];
	for (j = 0; j < lp->nentries; j++) {
	    if (FILENAME_CMP(name, lp->dir[j].fname) == 0) {
		*lib = lp;
		*startp = lp->dir[j].foffset;
		*sizep = lp->dir[j].fsize;
		return TRUE;
	    }
	}
    }
    *lib = NULL;
    *startp = *sizep = 0;
    return FALSE;
}